

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

ostream * pstd::operator<<(ostream *os,optional<int> *opt)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  
  bVar1 = opt->set;
  std::__ostream_insert<char,std::char_traits<char>>(os,"[ pstd::optional<",0x11);
  pcVar4 = _setvbuf + (*_setvbuf == '*');
  sVar2 = strlen(pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,sVar2);
  if (bVar1 == true) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"> set: true ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(os,"value: ",7);
    if (opt->set == false) {
      pbrt::LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xef,"Check failed: %s",(char (*) [4])0x30c2e65);
    }
    os = (ostream *)std::ostream::operator<<((ostream *)os,(int)opt->optionalValue);
    pcVar4 = " ]";
    lVar3 = 2;
  }
  else {
    pcVar4 = "> set: false value: n/a ]";
    lVar3 = 0x19;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,lVar3);
  return os;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const optional<T> &opt) {
    if (opt.has_value())
        return os << "[ pstd::optional<" << typeid(T).name() << "> set: true "
                  << "value: " << opt.value() << " ]";
    else
        return os << "[ pstd::optional<" << typeid(T).name()
                  << "> set: false value: n/a ]";
}